

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void build_color_point(chunk_conflict *c,int *colors,int *counts,_Bool *stairs,loc grid,
                      wchar_t color,_Bool diagonal)

{
  wchar_t w_00;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  queue *q;
  int *data;
  size_t sVar4;
  uintptr_t uVar5;
  loc grid_00;
  int iVar6;
  wchar_t n2;
  loc grid2;
  wchar_t n1;
  loc grid1;
  wchar_t i;
  int *added;
  queue *queue;
  wchar_t size;
  wchar_t w;
  wchar_t h;
  _Bool diagonal_local;
  wchar_t color_local;
  _Bool *stairs_local;
  int *counts_local;
  int *colors_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  w_00 = c->width;
  wVar2 = c->height * w_00;
  q = q_new((long)wVar2);
  data = (int *)mem_zalloc((long)wVar2 << 2);
  array_filler(data,L'\0',wVar2);
  wVar2 = grid_to_i(grid,w_00);
  q_push(q,(long)wVar2);
  counts[color] = 0;
  while (sVar4 = q_len(q), sVar4 != 0) {
    uVar5 = q_pop(q);
    grid2.x = (int)uVar5;
    i_to_grid(grid2.x,w_00,(loc *)&grid2.y);
    wVar2 = ignore_point(c,colors,(loc)stack0xffffffffffffff9c);
    if (wVar2 == L'\0') {
      colors[grid2.x] = color;
      counts[color] = counts[color] + 1;
      if ((stairs != (_Bool *)0x0) &&
         (_Var1 = square_isstairs((chunk *)c,stack0xffffffffffffff9c), _Var1)) {
        stairs[color] = true;
      }
      grid1.x = 0;
      while( true ) {
        iVar6 = 4;
        if (diagonal) {
          iVar6 = 8;
        }
        if (iVar6 <= grid1.x) break;
        grid_00 = loc_sum((loc)stack0xffffffffffffff9c,ddgrid_ddd[grid1.x]);
        wVar2 = grid_to_i(grid_00,w_00);
        wVar3 = ignore_point(c,colors,grid_00);
        if ((wVar3 == L'\0') && (data[wVar2] == 0)) {
          q_push(q,(long)wVar2);
          data[wVar2] = 1;
        }
        grid1.x = grid1.x + 1;
      }
    }
  }
  mem_free(data);
  q_free(q);
  return;
}

Assistant:

static void build_color_point(struct chunk *c, int colors[], int counts[],
		bool *stairs, struct loc grid, int color, bool diagonal) {
	int h = c->height;
	int w = c->width;
	int size = h * w;
	struct queue *queue = q_new(size);

	int *added = mem_zalloc(size * sizeof(int));

	array_filler(added, 0, size);

	q_push_int(queue, grid_to_i(grid, w));

	counts[color] = 0;

	while (q_len(queue) > 0) {
		int i;
		struct loc grid1;
		int n1 = q_pop_int(queue);

		i_to_grid(n1, w, &grid1);

		if (ignore_point(c, colors, grid1)) continue;

		colors[n1] = color;
		counts[color]++;
		if (stairs && square_isstairs(c, grid1)) stairs[color] = true;

		for (i = 0; i < (diagonal ? 8 : 4); i++) {
			struct loc grid2 = loc_sum(grid1, ddgrid_ddd[i]);
			int n2 = grid_to_i(grid2, w);
			if (ignore_point(c, colors, grid2)) continue;
			if (added[n2]) continue;

			q_push_int(queue, n2);
			added[n2] = 1;
		}
	}

	mem_free(added);
	q_free(queue);
}